

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void __thiscall
cmGeneratorTarget::GetFullNameInternal
          (cmGeneratorTarget *this,string *config,bool implib,string *outPrefix,string *outBase,
          string *outSuffix)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TargetType TVar2;
  cmMakefile *pcVar3;
  pointer pcVar4;
  string *psVar5;
  string *psVar6;
  bool bVar7;
  char *pcVar8;
  _Alloc_hider __s;
  char *pcVar9;
  LinkClosure *pLVar10;
  long *plVar11;
  char *extraout_RAX;
  size_t sVar12;
  size_type *psVar13;
  ulong *puVar14;
  uint uVar15;
  string ll;
  string fw_prefix;
  string local_f0;
  string local_d0;
  string local_b0;
  char *local_90;
  uint local_84;
  string *local_80;
  string *local_78;
  string *local_70;
  uint local_64;
  long *local_60 [2];
  long local_50 [2];
  char *local_40;
  string *local_38;
  
  if (MODULE_LIBRARY < this->Target->TargetTypeValue) {
    std::__cxx11::string::_M_replace
              ((ulong)outPrefix,0,(char *)outPrefix->_M_string_length,0x50ff0f);
    std::__cxx11::string::_M_assign((string *)outBase);
    std::__cxx11::string::_M_replace
              ((ulong)outSuffix,0,(char *)outSuffix->_M_string_length,0x50ff0f);
    return;
  }
  paVar1 = &local_f0.field_2;
  local_78 = outBase;
  local_70 = outPrefix;
  if (implib) {
    pcVar3 = this->Makefile;
    local_f0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,"CMAKE_IMPORT_LIBRARY_SUFFIX","");
    pcVar8 = cmMakefile::GetDefinition(pcVar3,&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if (pcVar8 == (char *)0x0) {
      std::__cxx11::string::_M_replace
                ((ulong)local_70,0,(char *)local_70->_M_string_length,0x50ff0f);
      std::__cxx11::string::_M_replace
                ((ulong)local_78,0,(char *)local_78->_M_string_length,0x50ff0f);
      std::__cxx11::string::_M_replace
                ((ulong)outSuffix,0,(char *)outSuffix->_M_string_length,0x50ff0f);
      return;
    }
    TVar2 = this->Target->TargetTypeValue;
    if ((TVar2 & ~STATIC_LIBRARY) == SHARED_LIBRARY) {
      if (!implib) goto LAB_00376870;
    }
    else if (TVar2 != EXECUTABLE || !implib) goto LAB_00376870;
    local_f0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"IMPORT_PREFIX","");
    __s._M_p = cmTarget::GetProperty(this->Target,&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    local_f0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"IMPORT_SUFFIX","");
    pcVar8 = cmTarget::GetProperty(this->Target,&local_f0);
    local_90 = pcVar8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      pcVar8 = extraout_RAX;
    }
    local_84 = (uint)CONCAT71((int7)((ulong)pcVar8 >> 8),1);
  }
  else {
LAB_00376870:
    local_f0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"PREFIX","");
    __s._M_p = cmTarget::GetProperty(this->Target,&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    local_f0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"SUFFIX","");
    local_90 = cmTarget::GetProperty(this->Target,&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    local_84 = 0;
  }
  local_38 = outSuffix;
  if (config->_M_string_length == 0) {
    local_40 = (char *)0x0;
  }
  else {
    cmsys::SystemTools::UpperCase(&local_f0,config);
    std::__cxx11::string::append((char *)&local_f0);
    pcVar8 = cmTarget::GetProperty(this->Target,&local_f0);
    if (((pcVar8 == (char *)0x0) || (bVar7 = IsAppBundleOnApple(this), bVar7)) ||
       (bVar7 = IsFrameworkOnApple(this), bVar7)) {
      pcVar8 = (char *)0x0;
    }
    local_40 = pcVar8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
  }
  bVar7 = local_84._0_1_;
  uVar15 = local_84 & 0xff;
  pcVar8 = cmTarget::GetPrefixVariableInternal(this->Target,local_84._0_1_);
  local_64 = uVar15;
  pcVar9 = cmTarget::GetSuffixVariableInternal(this->Target,bVar7);
  local_80 = config;
  pLVar10 = GetLinkClosure(this,config);
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  pcVar4 = (pLVar10->LinkerLanguage)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,pcVar4,pcVar4 + (pLVar10->LinkerLanguage)._M_string_length);
  if (local_f0._M_string_length != 0) {
    if (pcVar9 != (char *)0x0 && local_90 == (char *)0x0) {
      if (*pcVar9 == '\0') {
        local_90 = (char *)0x0;
      }
      else {
        local_60[0] = local_50;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"_","");
        strlen(pcVar9);
        plVar11 = (long *)std::__cxx11::string::replace((ulong)local_60,0,(char *)0x0,(ulong)pcVar9)
        ;
        psVar13 = (size_type *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_b0.field_2._M_allocated_capacity = *psVar13;
          local_b0.field_2._8_8_ = plVar11[3];
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        }
        else {
          local_b0.field_2._M_allocated_capacity = *psVar13;
          local_b0._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_b0._M_string_length = plVar11[1];
        *plVar11 = (long)psVar13;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_b0,(ulong)local_f0._M_dataplus._M_p);
        puVar14 = (ulong *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar14) {
          local_d0.field_2._M_allocated_capacity = *puVar14;
          local_d0.field_2._8_8_ = plVar11[3];
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        }
        else {
          local_d0.field_2._M_allocated_capacity = *puVar14;
          local_d0._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_d0._M_string_length = plVar11[1];
        *plVar11 = (long)puVar14;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        if (local_60[0] != local_50) {
          operator_delete(local_60[0],local_50[0] + 1);
        }
        local_90 = cmMakefile::GetDefinition(this->Makefile,&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
      }
    }
    if (pcVar8 != (char *)0x0 &&
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__s._M_p ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      if (*pcVar8 == '\0') {
        __s._M_p = (pointer)0x0;
      }
      else {
        local_60[0] = local_50;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"_","");
        strlen(pcVar8);
        plVar11 = (long *)std::__cxx11::string::replace((ulong)local_60,0,(char *)0x0,(ulong)pcVar8)
        ;
        psVar13 = (size_type *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_b0.field_2._M_allocated_capacity = *psVar13;
          local_b0.field_2._8_8_ = plVar11[3];
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        }
        else {
          local_b0.field_2._M_allocated_capacity = *psVar13;
          local_b0._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_b0._M_string_length = plVar11[1];
        *plVar11 = (long)psVar13;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_b0,(ulong)local_f0._M_dataplus._M_p);
        puVar14 = (ulong *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar14) {
          local_d0.field_2._M_allocated_capacity = *puVar14;
          local_d0.field_2._8_8_ = plVar11[3];
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        }
        else {
          local_d0.field_2._M_allocated_capacity = *puVar14;
          local_d0._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_d0._M_string_length = plVar11[1];
        *plVar11 = (long)puVar14;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        if (local_60[0] != local_50) {
          operator_delete(local_60[0],local_50[0] + 1);
        }
        __s._M_p = cmMakefile::GetDefinition(this->Makefile,&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
  if ((pcVar8 != (char *)0x0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__s._M_p ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0)) {
    pcVar3 = this->Makefile;
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    sVar12 = strlen(pcVar8);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,pcVar8,pcVar8 + sVar12);
    __s._M_p = cmMakefile::GetSafeDefinition(pcVar3,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
  }
  psVar5 = local_80;
  if ((pcVar9 != (char *)0x0) && (local_90 == (char *)0x0)) {
    pcVar3 = this->Makefile;
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    sVar12 = strlen(pcVar9);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,pcVar9,pcVar9 + sVar12);
    local_90 = cmMakefile::GetSafeDefinition(pcVar3,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
  }
  psVar6 = local_70;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  local_d0._M_string_length = 0;
  local_d0.field_2._M_allocated_capacity =
       local_d0.field_2._M_allocated_capacity & 0xffffffffffffff00;
  bVar7 = IsFrameworkOnApple(this);
  if (bVar7) {
    GetOutputName(&local_b0,this,psVar5,false);
    std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&local_d0);
    local_90 = (char *)0x0;
    __s._M_p = local_d0._M_dataplus._M_p;
  }
  bVar7 = IsCFBundleOnApple(this);
  if (bVar7) {
    GetCFBundleDirectory(&local_b0,this,psVar5,false);
    std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&local_d0);
    local_90 = (char *)0x0;
    __s._M_p = local_d0._M_dataplus._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__s._M_p ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    __s._M_p = "";
  }
  pcVar8 = (char *)psVar6->_M_string_length;
  strlen(__s._M_p);
  std::__cxx11::string::_M_replace((ulong)psVar6,0,pcVar8,(ulong)__s._M_p);
  GetOutputName(&local_b0,this,psVar5,SUB41(local_64,0));
  std::__cxx11::string::_M_append((char *)local_78,(ulong)local_b0._M_dataplus._M_p);
  paVar1 = &local_b0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)local_78);
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"SOVERSION","");
  pcVar8 = cmTarget::GetProperty(this->Target,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((pcVar8 != (char *)0x0) &&
     ((char)local_84 == '\0' && this->Target->TargetTypeValue == SHARED_LIBRARY)) {
    pcVar3 = this->Makefile;
    local_b0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"CMAKE_SHARED_LIBRARY_NAME_WITH_VERSION","");
    bVar7 = cmMakefile::IsOn(pcVar3,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if (bVar7) {
      std::__cxx11::string::append((char *)local_78);
      std::__cxx11::string::append((char *)local_78);
    }
  }
  psVar5 = local_38;
  pcVar8 = "";
  if (local_90 != (char *)0x0) {
    pcVar8 = local_90;
  }
  pcVar9 = (char *)local_38->_M_string_length;
  strlen(pcVar8);
  std::__cxx11::string::_M_replace((ulong)psVar5,0,pcVar9,(ulong)pcVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGeneratorTarget::GetFullNameInternal(const std::string& config,
                                            bool implib,
                                            std::string& outPrefix,
                                            std::string& outBase,
                                            std::string& outSuffix) const
{
  // Use just the target name for non-main target types.
  if(this->GetType() != cmState::STATIC_LIBRARY &&
     this->GetType() != cmState::SHARED_LIBRARY &&
     this->GetType() != cmState::MODULE_LIBRARY &&
     this->GetType() != cmState::EXECUTABLE)
    {
    outPrefix = "";
    outBase = this->GetName();
    outSuffix = "";
    return;
    }

  // Return an empty name for the import library if this platform
  // does not support import libraries.
  if(implib &&
     !this->Makefile->GetDefinition("CMAKE_IMPORT_LIBRARY_SUFFIX"))
    {
    outPrefix = "";
    outBase = "";
    outSuffix = "";
    return;
    }

  // The implib option is only allowed for shared libraries, module
  // libraries, and executables.
  if(this->GetType() != cmState::SHARED_LIBRARY &&
     this->GetType() != cmState::MODULE_LIBRARY &&
     this->GetType() != cmState::EXECUTABLE)
    {
    implib = false;
    }

  // Compute the full name for main target types.
  const char* targetPrefix = (implib
                              ? this->GetProperty("IMPORT_PREFIX")
                              : this->GetProperty("PREFIX"));
  const char* targetSuffix = (implib
                              ? this->GetProperty("IMPORT_SUFFIX")
                              : this->GetProperty("SUFFIX"));
  const char* configPostfix = 0;
  if(!config.empty())
    {
    std::string configProp = cmSystemTools::UpperCase(config);
    configProp += "_POSTFIX";
    configPostfix = this->GetProperty(configProp);
    // Mac application bundles and frameworks have no postfix.
    if(configPostfix &&
       (this->IsAppBundleOnApple() || this->IsFrameworkOnApple()))
      {
      configPostfix = 0;
      }
    }
  const char* prefixVar = this->Target->GetPrefixVariableInternal(implib);
  const char* suffixVar = this->Target->GetSuffixVariableInternal(implib);

  // Check for language-specific default prefix and suffix.
  std::string ll = this->GetLinkerLanguage(config);
  if(!ll.empty())
    {
    if(!targetSuffix && suffixVar && *suffixVar)
      {
      std::string langSuff = suffixVar + std::string("_") + ll;
      targetSuffix = this->Makefile->GetDefinition(langSuff);
      }
    if(!targetPrefix && prefixVar && *prefixVar)
      {
      std::string langPrefix = prefixVar + std::string("_") + ll;
      targetPrefix = this->Makefile->GetDefinition(langPrefix);
      }
    }

  // if there is no prefix on the target use the cmake definition
  if(!targetPrefix && prefixVar)
    {
    targetPrefix = this->Makefile->GetSafeDefinition(prefixVar);
    }
  // if there is no suffix on the target use the cmake definition
  if(!targetSuffix && suffixVar)
    {
    targetSuffix = this->Makefile->GetSafeDefinition(suffixVar);
    }

  // frameworks have directory prefix but no suffix
  std::string fw_prefix;
  if(this->IsFrameworkOnApple())
    {
    fw_prefix = this->GetOutputName(config, false);
    fw_prefix += ".framework/";
    targetPrefix = fw_prefix.c_str();
    targetSuffix = 0;
    }

  if(this->IsCFBundleOnApple())
    {
    fw_prefix = this->GetCFBundleDirectory(config, false);
    fw_prefix += "/";
    targetPrefix = fw_prefix.c_str();
    targetSuffix = 0;
    }

  // Begin the final name with the prefix.
  outPrefix = targetPrefix?targetPrefix:"";

  // Append the target name or property-specified name.
  outBase += this->GetOutputName(config, implib);

  // Append the per-configuration postfix.
  outBase += configPostfix?configPostfix:"";

  // Name shared libraries with their version number on some platforms.
  if(const char* soversion = this->GetProperty("SOVERSION"))
    {
    if(this->GetType() == cmState::SHARED_LIBRARY && !implib &&
       this->Makefile->IsOn("CMAKE_SHARED_LIBRARY_NAME_WITH_VERSION"))
      {
      outBase += "-";
      outBase += soversion;
      }
    }

  // Append the suffix.
  outSuffix = targetSuffix?targetSuffix:"";
}